

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_array.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseArray(Parser *this)

{
  allocator<pfederc::Position> *paVar1;
  size_t *this_00;
  initializer_list<pfederc::Position> __l;
  initializer_list<pfederc::Position> __l_00;
  initializer_list<pfederc::Position> __l_01;
  bool bVar2;
  type pEVar3;
  size_t sVar4;
  Token *pTVar5;
  Position *pPVar6;
  Position *pPVar7;
  pointer pEVar8;
  Parser *in_RSI;
  undefined1 local_2a8 [32];
  undefined1 local_288 [8];
  Position pos;
  Position local_268;
  Position *local_250;
  pointer local_248;
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_240;
  undefined1 local_228 [24];
  Token *local_210;
  Token *endToken;
  Position local_200;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  Position local_1c8;
  Position *local_1b0;
  pointer local_1a8;
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_1a0;
  undefined1 local_188 [24];
  Token *local_170;
  Token *endToken_2;
  iterator local_160;
  const_iterator local_158;
  undefined1 local_150 [24];
  undefined1 local_138 [16];
  size_t local_128;
  BiOpExpr *biopexpr;
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  exprs;
  Position pos_2;
  Position local_e8;
  Position local_d0;
  undefined1 local_b8 [8];
  Position pos_1;
  Position local_98;
  Position *local_80;
  size_type local_78;
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_70;
  undefined1 local_58 [24];
  Token *local_40;
  Token *endToken_1;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr1;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr0;
  Token *startToken;
  Parser *this_local;
  
  expr0._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       Lexer::getCurrentToken(in_RSI->lexer);
  sanityExpect(in_RSI,TOK_OP_ARR_BRACKET_OPEN);
  parseExpression((Parser *)&stack0xffffffffffffffd8,(Precedence)in_RSI);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffd8);
  if (bVar2) {
    bVar2 = expect(in_RSI,TOK_STMT);
    if (bVar2) {
      parseExpression((Parser *)&endToken_1,(Precedence)in_RSI);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&endToken_1);
      if (bVar2) {
        local_40 = Lexer::getCurrentToken(in_RSI->lexer);
        bVar2 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
        if (!bVar2) {
          local_58._6_2_ = 2;
          local_58._0_4_ = 2;
          pTVar5 = Lexer::getCurrentToken(in_RSI->lexer);
          pPVar6 = Token::getPosition(pTVar5);
          pPVar7 = Token::getPosition((Token *)expr0._M_t.
                                               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                               .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                               _M_head_impl);
          Position::Position(&local_98,pPVar7);
          local_78 = 1;
          paVar1 = (allocator<pfederc::Position> *)((long)&pos_1.endIndex + 7);
          local_80 = &local_98;
          std::allocator<pfederc::Position>::allocator(paVar1);
          __l_01._M_len = local_78;
          __l_01._M_array = local_80;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    (&local_70,__l_01,paVar1);
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                    ((Level *)(local_58 + 8),(SyntaxErrorCode *)(local_58 + 6),(Position *)local_58,
                     (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)pPVar6);
          generateError((Parser *)(local_58 + 0x10),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)in_RSI);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_58 + 0x10));
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)(local_58 + 8));
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::~vector(&local_70);
          std::allocator<pfederc::Position>::~allocator
                    ((allocator<pfederc::Position> *)((long)&pos_1.endIndex + 7));
        }
        pPVar6 = Token::getPosition((Token *)expr0._M_t.
                                             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                             .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                             _M_head_impl);
        pEVar8 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &stack0xffffffffffffffd8);
        pPVar7 = Expr::getPosition(pEVar8);
        Position::operator+(&local_e8,pPVar6,pPVar7);
        pEVar8 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &endToken_1);
        pPVar6 = Expr::getPosition(pEVar8);
        Position::operator+(&local_d0,&local_e8,pPVar6);
        pPVar6 = Token::getPosition(local_40);
        Position::operator+((Position *)local_b8,&local_d0,pPVar6);
        std::
        make_unique<pfederc::ArrayCpyExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)&pos_2.endIndex,(Position *)in_RSI->lexer,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_b8,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                   &stack0xffffffffffffffd8);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::ArrayCpyExpr,std::default_delete<pfederc::ArrayCpyExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::ArrayCpyExpr,_std::default_delete<pfederc::ArrayCpyExpr>_> *
                   )&pos_2.endIndex);
        std::unique_ptr<pfederc::ArrayCpyExpr,_std::default_delete<pfederc::ArrayCpyExpr>_>::
        ~unique_ptr((unique_ptr<pfederc::ArrayCpyExpr,_std::default_delete<pfederc::ArrayCpyExpr>_>
                     *)&pos_2.endIndex);
      }
      else {
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
      }
      expr1._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&endToken_1);
    }
    else {
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &stack0xffffffffffffffd8);
      bVar2 = isBiOpExpr(pEVar3,TOK_OP_COMMA);
      if (bVar2) {
        pEVar8 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &stack0xffffffffffffffd8);
        pPVar6 = Expr::getPosition(pEVar8);
        Position::Position((Position *)
                           &exprs.
                            super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                            ._M_impl._M_node._M_size,pPVar6);
        std::__cxx11::
        list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::list((list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)&biopexpr);
        while( true ) {
          pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                             ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                              &stack0xffffffffffffffd8);
          bVar2 = isBiOpExpr(pEVar3,TOK_OP_COMMA);
          if (!bVar2) break;
          pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                             ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                              &stack0xffffffffffffffd8);
          sVar4 = __dynamic_cast(pEVar3,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
          if (sVar4 == 0) {
            __cxa_bad_cast();
          }
          local_128 = sVar4;
          local_138._0_8_ =
               std::__cxx11::
               list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
               ::begin((list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                        *)&biopexpr);
          std::
          _List_const_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
          ::_List_const_iterator
                    ((_List_const_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                      *)(local_138 + 8),(iterator *)local_138);
          BiOpExpr::getRightPtr((BiOpExpr *)(local_150 + 0x10));
          local_150._8_8_ =
               std::__cxx11::
               list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
               ::insert((list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                         *)&biopexpr,(const_iterator)local_138._8_8_,
                        (value_type *)(local_150 + 0x10));
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                     (local_150 + 0x10));
          BiOpExpr::getLeftPtr((BiOpExpr *)local_150);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                     &stack0xffffffffffffffd8,
                     (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_150);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_150);
        }
        local_160._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ::begin((list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                      *)&biopexpr);
        std::
        _List_const_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>::
        _List_const_iterator(&local_158,&local_160);
        endToken_2 = (Token *)std::__cxx11::
                              list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                              ::insert((list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                        *)&biopexpr,local_158,(value_type *)&stack0xffffffffffffffd8
                                      );
        local_170 = Lexer::getCurrentToken(in_RSI->lexer);
        bVar2 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
        if (!bVar2) {
          local_188._6_2_ = 2;
          local_188._0_4_ = 2;
          pTVar5 = Lexer::getCurrentToken(in_RSI->lexer);
          pPVar6 = Token::getPosition(pTVar5);
          pPVar7 = Token::getPosition((Token *)expr0._M_t.
                                               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                               .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                               _M_head_impl);
          Position::Position(&local_1c8,pPVar7);
          local_1a8 = (pointer)0x1;
          local_1b0 = &local_1c8;
          std::allocator<pfederc::Position>::allocator
                    ((allocator<pfederc::Position> *)(local_1d8 + 0xf));
          __l_00._M_len = (size_type)local_1a8;
          __l_00._M_array = local_1b0;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    (&local_1a0,__l_00,(allocator<pfederc::Position> *)(local_1d8 + 0xf));
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                    ((Level *)(local_188 + 8),(SyntaxErrorCode *)(local_188 + 6),
                     (Position *)local_188,
                     (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)pPVar6);
          generateError((Parser *)(local_188 + 0x10),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)in_RSI);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_188 + 0x10));
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)(local_188 + 8));
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::~vector(&local_1a0);
          std::allocator<pfederc::Position>::~allocator
                    ((allocator<pfederc::Position> *)(local_1d8 + 0xf));
        }
        pPVar6 = Token::getPosition((Token *)expr0._M_t.
                                             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                             .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                             _M_head_impl);
        this_00 = &exprs.
                   super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                   ._M_impl._M_node._M_size;
        Position::operator+(&local_200,(Position *)this_00,pPVar6);
        pPVar6 = Token::getPosition(local_170);
        Position::operator+((Position *)local_1e8,&local_200,pPVar6);
        pos_2.startIndex = local_1d8._0_8_;
        exprs.
        super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ._M_impl._M_node._M_size = local_1e8._0_8_;
        pos_2.line = local_1e8._8_8_;
        std::
        make_unique<pfederc::ArrayLitExpr,pfederc::Lexer&,pfederc::Position&,std::__cxx11::list<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  ((Lexer *)&endToken,(Position *)in_RSI->lexer,
                   (list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)this_00);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::ArrayLitExpr,std::default_delete<pfederc::ArrayLitExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::ArrayLitExpr,_std::default_delete<pfederc::ArrayLitExpr>_> *
                   )&endToken);
        std::unique_ptr<pfederc::ArrayLitExpr,_std::default_delete<pfederc::ArrayLitExpr>_>::
        ~unique_ptr((unique_ptr<pfederc::ArrayLitExpr,_std::default_delete<pfederc::ArrayLitExpr>_>
                     *)&endToken);
        expr1._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._4_4_ = 1;
        std::__cxx11::
        list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::~list((list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 *)&biopexpr);
      }
      else {
        local_210 = Lexer::getCurrentToken(in_RSI->lexer);
        bVar2 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
        if (!bVar2) {
          local_228._6_2_ = 2;
          local_228._0_4_ = 2;
          pTVar5 = Lexer::getCurrentToken(in_RSI->lexer);
          pPVar6 = Token::getPosition(pTVar5);
          pPVar7 = Token::getPosition((Token *)expr0._M_t.
                                               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                               .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                               _M_head_impl);
          Position::Position(&local_268,pPVar7);
          local_248 = (pointer)0x1;
          paVar1 = (allocator<pfederc::Position> *)((long)&pos.endIndex + 7);
          local_250 = &local_268;
          std::allocator<pfederc::Position>::allocator(paVar1);
          __l._M_len = (size_type)local_248;
          __l._M_array = local_250;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    (&local_240,__l,paVar1);
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                    ((Level *)(local_228 + 8),(SyntaxErrorCode *)(local_228 + 6),
                     (Position *)local_228,
                     (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)pPVar6);
          generateError((Parser *)(local_228 + 0x10),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)in_RSI);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_228 + 0x10));
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)(local_228 + 8));
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::~vector(&local_240);
          std::allocator<pfederc::Position>::~allocator
                    ((allocator<pfederc::Position> *)((long)&pos.endIndex + 7));
        }
        pPVar6 = Token::getPosition((Token *)expr0._M_t.
                                             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                             .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                             _M_head_impl);
        pEVar8 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &stack0xffffffffffffffd8);
        pPVar7 = Expr::getPosition(pEVar8);
        Position::operator+((Position *)(local_2a8 + 8),pPVar6,pPVar7);
        pPVar6 = Token::getPosition(local_210);
        Position::operator+((Position *)local_288,(Position *)(local_2a8 + 8),pPVar6);
        std::
        make_unique<pfederc::ArrayEmptyExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)local_2a8,(Position *)in_RSI->lexer,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_288);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::ArrayEmptyExpr,std::default_delete<pfederc::ArrayEmptyExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::ArrayEmptyExpr,_std::default_delete<pfederc::ArrayEmptyExpr>_>
                    *)local_2a8);
        std::unique_ptr<pfederc::ArrayEmptyExpr,_std::default_delete<pfederc::ArrayEmptyExpr>_>::
        ~unique_ptr((unique_ptr<pfederc::ArrayEmptyExpr,_std::default_delete<pfederc::ArrayEmptyExpr>_>
                     *)local_2a8);
        expr1._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._4_4_ = 1;
      }
    }
  }
  else {
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0);
    expr1._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._4_4_ = 1;
  }
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
             &stack0xffffffffffffffd8);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseArray() noexcept {
  const Token *const startToken = lexer.getCurrentToken();
  sanityExpect(TokenType::TOK_OP_ARR_BRACKET_OPEN);

  std::unique_ptr<Expr> expr0(parseExpression());
  if (!expr0)
    return nullptr;

  if (expect(TokenType::TOK_STMT)) {
    std::unique_ptr<Expr> expr1(parseExpression());
    if (!expr1)
      return nullptr;

    const Token *const endToken = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
        lexer.getCurrentToken()->getPosition(),
        std::vector<Position> { startToken->getPosition() }));
    }

    const Position pos(startToken->getPosition() +
      expr0->getPosition() + expr1->getPosition() + endToken->getPosition());

    return std::make_unique<ArrayCpyExpr>(lexer, pos,
      std::move(expr0), std::move(expr1));
  }
  // now it's either an ArrayEmptyExpr or ArrayLitExpr
  if (isBiOpExpr(*expr0, TokenType::TOK_OP_COMMA)) {
    Position pos(expr0->getPosition());

    std::list<std::unique_ptr<Expr>> exprs;
    while (isBiOpExpr(*expr0, TokenType::TOK_OP_COMMA)) {
      BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr0);
      exprs.insert(exprs.begin(), biopexpr.getRightPtr());
      expr0 = biopexpr.getLeftPtr();
    }

    exprs.insert(exprs.begin(), std::move(expr0));

    const Token *const endToken = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
        lexer.getCurrentToken()->getPosition(),
        std::vector<Position> { startToken->getPosition() }));
    }

    pos = pos + startToken->getPosition() + endToken->getPosition();

    return std::make_unique<ArrayLitExpr>(lexer, pos, std::move(exprs));
  }

  const Token *const endToken = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { startToken->getPosition() }));
  }

  const Position pos(startToken->getPosition() +
    expr0->getPosition() + endToken->getPosition());

  return std::make_unique<ArrayEmptyExpr>(lexer, pos,
    std::move(expr0));
}